

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O3

string * cmsys::Glob::PatternToRegex
                   (string *__return_storage_ptr__,string *pattern,bool require_whole_string,
                   bool preserve_case)

{
  byte *pbVar1;
  byte bVar2;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  char *pcVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  long lVar7;
  
  pcVar3 = "";
  if ((int)CONCAT71(in_register_00000011,require_whole_string) != 0) {
    pcVar3 = "^";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar3,
             pcVar3 + (CONCAT71(in_register_00000011,require_whole_string) & 0xffffffff),
             CONCAT71(in_register_00000009,preserve_case));
  if (pattern->_M_string_length != 0) {
    pbVar6 = (byte *)(pattern->_M_dataplus)._M_p;
    pbVar4 = pbVar6 + pattern->_M_string_length;
    do {
      bVar2 = *pbVar6;
      if (bVar2 == 0x5b) {
        pbVar5 = pbVar6 + 1;
        if (pbVar5 == pbVar4) {
          lVar7 = 1;
        }
        else {
          lVar7 = (ulong)(*pbVar5 == 0x5e || *pbVar5 == 0x21) + 1;
        }
        if (pbVar6 + lVar7 != pbVar4) {
          lVar7 = lVar7 + (ulong)(pbVar6[lVar7] == 0x5d);
        }
LAB_003b31a3:
        if (pbVar6 + lVar7 != pbVar4) {
          if (pbVar6[lVar7] != 0x5d) goto code_r0x003b31b3;
          pbVar1 = pbVar6 + lVar7;
          if (pbVar1 != pbVar4) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            if ((lVar7 != 1) && (*pbVar5 == 0x21)) {
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              pbVar5 = pbVar6 + 2;
            }
            for (; pbVar1 != pbVar5; pbVar5 = pbVar5 + 1) {
              if (*pbVar5 == 0x5c) {
                std::__cxx11::string::append((char *)__return_storage_ptr__);
              }
              std::__cxx11::string::push_back((char)__return_storage_ptr__);
            }
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            pbVar6 = pbVar1;
            goto LAB_003b325b;
          }
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else if ((bVar2 == 0x3f) || (bVar2 == 0x2a)) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        if ((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        std::__cxx11::string::_M_replace_aux
                  ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01');
      }
LAB_003b325b:
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != pbVar4);
  }
  if (require_whole_string) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
code_r0x003b31b3:
  lVar7 = lVar7 + 1;
  goto LAB_003b31a3;
}

Assistant:

std::string Glob::PatternToRegex(const std::string& pattern,
                                 bool require_whole_string, bool preserve_case)
{
  // Incrementally build the regular expression from the pattern.
  std::string regex = require_whole_string ? "^" : "";
  std::string::const_iterator pattern_first = pattern.begin();
  std::string::const_iterator pattern_last = pattern.end();
  for (std::string::const_iterator i = pattern_first; i != pattern_last; ++i) {
    int c = *i;
    if (c == '*') {
      // A '*' (not between brackets) matches any string.
      // We modify this to not match slashes since the original glob
      // pattern documentation was meant for matching file name
      // components separated by slashes.
      regex += "[^/]*";
    } else if (c == '?') {
      // A '?' (not between brackets) matches any single character.
      // We modify this to not match slashes since the original glob
      // pattern documentation was meant for matching file name
      // components separated by slashes.
      regex += "[^/]";
    } else if (c == '[') {
      // Parse out the bracket expression.  It begins just after the
      // opening character.
      std::string::const_iterator bracket_first = i + 1;
      std::string::const_iterator bracket_last = bracket_first;

      // The first character may be complementation '!' or '^'.
      if (bracket_last != pattern_last &&
          (*bracket_last == '!' || *bracket_last == '^')) {
        ++bracket_last;
      }

      // If the next character is a ']' it is included in the brackets
      // because the bracket string may not be empty.
      if (bracket_last != pattern_last && *bracket_last == ']') {
        ++bracket_last;
      }

      // Search for the closing ']'.
      while (bracket_last != pattern_last && *bracket_last != ']') {
        ++bracket_last;
      }

      // Check whether we have a complete bracket string.
      if (bracket_last == pattern_last) {
        // The bracket string did not end, so it was opened simply by
        // a '[' that is supposed to be matched literally.
        regex += "\\[";
      } else {
        // Convert the bracket string to its regex equivalent.
        std::string::const_iterator k = bracket_first;

        // Open the regex block.
        regex += "[";

        // A regex range complement uses '^' instead of '!'.
        if (k != bracket_last && *k == '!') {
          regex += "^";
          ++k;
        }

        // Convert the remaining characters.
        for (; k != bracket_last; ++k) {
          // Backslashes must be escaped.
          if (*k == '\\') {
            regex += "\\";
          }

          // Store this character.
          regex += *k;
        }

        // Close the regex block.
        regex += "]";

        // Jump to the end of the bracket string.
        i = bracket_last;
      }
    } else {
      // A single character matches itself.
      int ch = c;
      if (!(('a' <= ch && ch <= 'z') || ('A' <= ch && ch <= 'Z') ||
            ('0' <= ch && ch <= '9'))) {
        // Escape the non-alphanumeric character.
        regex += "\\";
      }
#if defined(KWSYS_GLOB_CASE_INDEPENDENT)
      else {
        // On case-insensitive systems file names are converted to lower
        // case before matching.
        if (!preserve_case) {
          ch = tolower(ch);
        }
      }
#endif
      (void)preserve_case;
      // Store the character.
      regex.append(1, static_cast<char>(ch));
    }
  }

  if (require_whole_string) {
    regex += "$";
  }
  return regex;
}